

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der_writer.c
# Opt level: O0

int ossl_DER_w_null(WPACKET *pkt,int tag)

{
  int iVar1;
  uint in_ESI;
  WPACKET *in_RDI;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  WPACKET *in_stack_ffffffffffffffe8;
  undefined1 local_d;
  
  iVar1 = int_start_context(in_stack_ffffffffffffffe8,0);
  local_d = false;
  if (iVar1 != 0) {
    iVar1 = WPACKET_start_sub_packet((WPACKET *)0x4436e2);
    local_d = false;
    if (iVar1 != 0) {
      iVar1 = WPACKET_close(in_stack_ffffffffffffffe8);
      local_d = false;
      if (iVar1 != 0) {
        iVar1 = WPACKET_put_bytes__(in_RDI,in_ESI,(size_t)in_stack_ffffffffffffffe8);
        local_d = false;
        if (iVar1 != 0) {
          iVar1 = int_end_context((WPACKET *)CONCAT44(tag,in_stack_00000008),unaff_retaddr);
          local_d = iVar1 != 0;
        }
      }
    }
  }
  return (int)local_d;
}

Assistant:

int ossl_DER_w_null(WPACKET *pkt, int tag)
{
    return int_start_context(pkt, tag)
        && WPACKET_start_sub_packet(pkt)
        && WPACKET_close(pkt)
        && WPACKET_put_bytes_u8(pkt, DER_P_NULL)
        && int_end_context(pkt, tag);
}